

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestValueTestcheckNormalizeFloatingPointStr::runTestCase
          (TestValueTestcheckNormalizeFloatingPointStr *this)

{
  long in_RDI;
  char *in_stack_fffffffffffff8f8;
  allocator *expr;
  undefined8 in_stack_fffffffffffff900;
  uint uVar1;
  char *in_stack_fffffffffffff908;
  allocator *file;
  string *in_stack_fffffffffffff910;
  string *actual;
  string *in_stack_fffffffffffff918;
  string *expected;
  TestResult *in_stack_fffffffffffff920;
  TestResult *result;
  string *in_stack_fffffffffffff9a8;
  string *s;
  allocator local_5c1;
  string local_5c0 [32];
  string local_5a0 [39];
  allocator local_579;
  string local_578 [39];
  undefined1 local_551 [33];
  string local_530 [39];
  undefined1 local_509 [40];
  allocator local_4e1;
  string local_4e0 [32];
  string local_4c0 [39];
  allocator local_499;
  string local_498 [39];
  allocator local_471;
  string local_470 [32];
  string local_450 [39];
  allocator local_429;
  string local_428 [39];
  allocator local_401;
  string local_400 [32];
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [32];
  string local_370 [39];
  allocator local_349;
  string local_348 [39];
  allocator local_321;
  string local_320 [32];
  string local_300 [39];
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [39];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [32];
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [32];
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  uVar1 = (uint)((ulong)in_stack_fffffffffffff900 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"0.0",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"0.0",&local_81);
  ValueTest::normalizeFloatingPointStr(in_stack_fffffffffffff9a8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"0e0",&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"0e0",&local_f1);
  ValueTest::normalizeFloatingPointStr(in_stack_fffffffffffff9a8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"1234.0",&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"1234.0",&local_161);
  ValueTest::normalizeFloatingPointStr(in_stack_fffffffffffff9a8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"1234.0e0",&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"1234.0e0",&local_1d1);
  ValueTest::normalizeFloatingPointStr(in_stack_fffffffffffff9a8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"1234.0e+0",&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_240,"1234.0e+0",&local_241);
  ValueTest::normalizeFloatingPointStr(in_stack_fffffffffffff9a8);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  s = *(string **)(in_RDI + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"1234e-1",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"1234e-1",&local_2b1);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_290);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d8,"1234e10",&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"1234e10",&local_321);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_300);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"1234e10",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_390,"1234e010",&local_391);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"1234e+10",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_400,"1234e+010",&local_401);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"1234e-10",&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"1234e-010",&local_471);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"1234e+100",&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4e0,"1234e+100",&local_4e1);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,in_stack_fffffffffffff910,
             in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_4c0);
  std::__cxx11::string::~string(local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  expected = *(string **)(in_RDI + 8);
  result = (TestResult *)local_509;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_509 + 1),"1234e-100",(allocator *)result);
  actual = (string *)local_551;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_551 + 1),"1234e-100",(allocator *)actual);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual
            (result,expected,actual,in_stack_fffffffffffff908,uVar1,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_530);
  std::__cxx11::string::~string((string *)(local_551 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_551);
  std::__cxx11::string::~string((string *)(local_509 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_509);
  uVar1 = (uint)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  file = &local_579;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_578,"1234e+1",file);
  expr = &local_5c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5c0,"1234e+001",expr);
  ValueTest::normalizeFloatingPointStr(s);
  JsonTest::checkStringEqual(result,expected,actual,(char *)file,uVar1,(char *)expr);
  std::__cxx11::string::~string(local_5a0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator((allocator<char> *)&local_579);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, checkNormalizeFloatingPointStr) {
  JSONTEST_ASSERT_STRING_EQUAL("0.0", normalizeFloatingPointStr("0.0"));
  JSONTEST_ASSERT_STRING_EQUAL("0e0", normalizeFloatingPointStr("0e0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234.0", normalizeFloatingPointStr("1234.0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234.0e0",
                               normalizeFloatingPointStr("1234.0e0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234.0e+0",
                               normalizeFloatingPointStr("1234.0e+0"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e-1", normalizeFloatingPointStr("1234e-1"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e10", normalizeFloatingPointStr("1234e10"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e10",
                               normalizeFloatingPointStr("1234e010"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e+10",
                               normalizeFloatingPointStr("1234e+010"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e-10",
                               normalizeFloatingPointStr("1234e-010"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e+100",
                               normalizeFloatingPointStr("1234e+100"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e-100",
                               normalizeFloatingPointStr("1234e-100"));
  JSONTEST_ASSERT_STRING_EQUAL("1234e+1",
                               normalizeFloatingPointStr("1234e+001"));
}